

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float __thiscall
pbrt::DiffuseBxDF::PDF
          (DiffuseBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Float FVar5;
  Float FVar6;
  float fVar7;
  undefined4 in_XMM3_Db;
  undefined4 in_XMM3_Dd;
  
  FVar5 = SampledSpectrum::MaxComponentValue(&this->R);
  FVar6 = SampledSpectrum::MaxComponentValue(&this->T);
  fVar1 = (float)((uint)((byte)sampleFlags & 1) * (int)FVar5);
  fVar7 = 0.0;
  fVar2 = (float)((uint)((sampleFlags & Transmission) != Unset) * (int)FVar6);
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar2 != 0.0)) || (NAN(fVar2))) {
    auVar3._4_4_ = in_XMM3_Db;
    auVar3._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar3._8_4_ = 0;
    auVar3._12_4_ = in_XMM3_Dd;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar4 = vandps_avx512vl(auVar3,auVar4);
    fVar7 = fVar1 + fVar2;
    if (0.0 < wi.super_Tuple3<pbrt::Vector3,_float>.z * wo.super_Tuple3<pbrt::Vector3,_float>.z) {
      fVar2 = fVar1;
    }
    fVar7 = auVar4._0_4_ * 0.31830987 * (fVar2 / fVar7);
  }
  return fVar7;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        // Compute reflection and transmission probabilities for diffuse BSDF
        Float pr = R.MaxComponentValue(), pt = T.MaxComponentValue();
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;
        if (pr == 0 && pt == 0)
            return {};

        if (SameHemisphere(wo, wi))
            return pr / (pr + pt) * CosineHemispherePDF(AbsCosTheta(wi));
        else
            return pt / (pr + pt) * CosineHemispherePDF(AbsCosTheta(wi));
    }